

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall xscript::tokenizer::scanner::print(scanner *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [8];
  ostream *poVar5;
  token_t_conflict tVar6;
  token local_60;
  undefined1 auStack_48 [8];
  token t;
  
  token::token((token *)auStack_48);
LAB_0011904c:
  do {
    next(&local_60,this);
    t.literal._M_len = (size_t)local_60.literal._M_str;
    uVar2._0_4_ = local_60.type;
    uVar2._4_4_ = local_60._4_4_;
    t._0_8_ = local_60.literal._M_len;
    auStack_48 = (undefined1  [8])local_60._0_8_;
    auVar4 = auStack_48;
    auStack_48._0_4_ = local_60.type;
    uVar3 = auStack_48._0_4_;
    tVar6 = auStack_48._0_4_;
    if (1 < auStack_48._0_4_ - TK_EOF) {
      uVar1 = auStack_48._0_4_ - TK_SPACE;
      auStack_48 = (undefined1  [8])uVar2;
      if (uVar1 < 2) goto LAB_0011904c;
      auStack_48 = auVar4;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
      poVar5 = std::operator<<(poVar5,' ');
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)t.literal._M_len,t._0_8_);
      std::endl<char,std::char_traits<char>>(poVar5);
      tVar6 = auStack_48._0_4_;
      auVar4 = auStack_48;
    }
    auStack_48 = auVar4;
    if (tVar6 == TK_EOF) {
      return;
    }
  } while( true );
}

Assistant:

void scanner::print() {
    token t;
    do {
        t = next();
        if (t != TK_SPACE && t != TK_TAB && t != TK_EOL && t != TK_EOF) {
            std::cout << t.type << ' ' << t.literal << std::endl;
        }
    } while (t != TK_EOF);
}